

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void conn_shutdown(Curl_easy *data,connectdata *conn)

{
  connectdata *conn_local;
  Curl_easy *data_local;
  
  Curl_infof(data,"Closing connection %ld",conn->connection_id);
  Curl_ssl_close(data,conn,0);
  Curl_ssl_close(data,conn,1);
  if (conn->sock[1] != -1) {
    Curl_closesocket(data,conn,conn->sock[1]);
  }
  if (conn->sock[0] != -1) {
    Curl_closesocket(data,conn,conn->sock[0]);
  }
  if (conn->tempsock[0] != -1) {
    Curl_closesocket(data,conn,conn->tempsock[0]);
  }
  if (conn->tempsock[1] != -1) {
    Curl_closesocket(data,conn,conn->tempsock[1]);
  }
  return;
}

Assistant:

static void conn_shutdown(struct Curl_easy *data, struct connectdata *conn)
{
  DEBUGASSERT(conn);
  DEBUGASSERT(data);
  infof(data, "Closing connection %ld", conn->connection_id);

  /* possible left-overs from the async name resolvers */
  Curl_resolver_cancel(data);

  /* close the SSL stuff before we close any sockets since they will/may
     write to the sockets */
  Curl_ssl_close(data, conn, FIRSTSOCKET);
#ifndef CURL_DISABLE_FTP
  Curl_ssl_close(data, conn, SECONDARYSOCKET);
#endif

  /* close possibly still open sockets */
  if(CURL_SOCKET_BAD != conn->sock[SECONDARYSOCKET])
    Curl_closesocket(data, conn, conn->sock[SECONDARYSOCKET]);
  if(CURL_SOCKET_BAD != conn->sock[FIRSTSOCKET])
    Curl_closesocket(data, conn, conn->sock[FIRSTSOCKET]);
  if(CURL_SOCKET_BAD != conn->tempsock[0])
    Curl_closesocket(data, conn, conn->tempsock[0]);
  if(CURL_SOCKET_BAD != conn->tempsock[1])
    Curl_closesocket(data, conn, conn->tempsock[1]);
}